

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void XYcZ_add(uECC_word_t *X1,uECC_word_t *Y1,uECC_word_t *X2,uECC_word_t *Y2,uECC_Curve curve)

{
  uECC_word_t *mod;
  char num_words;
  uECC_word_t t5 [4];
  uECC_word_t product [8];
  uECC_word_t local_98 [4];
  uECC_word_t local_78 [9];
  
  num_words = curve->num_words;
  mod = curve->p;
  uECC_vli_modSub(local_98,X2,X1,mod,num_words);
  uECC_vli_mult(local_78,local_98,local_98,num_words);
  (*curve->mmod_fast)(local_98,local_78);
  uECC_vli_mult(local_78,X1,local_98,curve->num_words);
  (*curve->mmod_fast)(X1,local_78);
  uECC_vli_mult(local_78,X2,local_98,curve->num_words);
  (*curve->mmod_fast)(X2,local_78);
  uECC_vli_modSub(Y2,Y2,Y1,mod,num_words);
  uECC_vli_mult(local_78,Y2,Y2,curve->num_words);
  (*curve->mmod_fast)(local_98,local_78);
  uECC_vli_modSub(local_98,local_98,X1,mod,num_words);
  uECC_vli_modSub(local_98,local_98,X2,mod,num_words);
  uECC_vli_modSub(X2,X2,X1,mod,num_words);
  uECC_vli_mult(local_78,Y1,X2,curve->num_words);
  (*curve->mmod_fast)(Y1,local_78);
  uECC_vli_modSub(X2,X1,local_98,mod,num_words);
  uECC_vli_mult(local_78,Y2,X2,curve->num_words);
  (*curve->mmod_fast)(Y2,local_78);
  uECC_vli_modSub(Y2,Y2,Y1,mod,num_words);
  if ('\0' < num_words) {
    memcpy(X2,local_98,(long)(int)num_words << 3);
  }
  return;
}

Assistant:

static void XYcZ_add(uECC_word_t * X1,
                     uECC_word_t * Y1,
                     uECC_word_t * X2,
                     uECC_word_t * Y2,
                     uECC_Curve curve) {
    /* t1 = X1, t2 = Y1, t3 = X2, t4 = Y2 */
    uECC_word_t t5[uECC_MAX_WORDS];
    wordcount_t num_words = curve->num_words;

    uECC_vli_modSub(t5, X2, X1, curve->p, num_words); /* t5 = x2 - x1 */
    uECC_vli_modSquare_fast(t5, t5, curve);                  /* t5 = (x2 - x1)^2 = A */
    uECC_vli_modMult_fast(X1, X1, t5, curve);                /* t1 = x1*A = B */
    uECC_vli_modMult_fast(X2, X2, t5, curve);                /* t3 = x2*A = C */
    uECC_vli_modSub(Y2, Y2, Y1, curve->p, num_words); /* t4 = y2 - y1 */
    uECC_vli_modSquare_fast(t5, Y2, curve);                  /* t5 = (y2 - y1)^2 = D */

    uECC_vli_modSub(t5, t5, X1, curve->p, num_words); /* t5 = D - B */
    uECC_vli_modSub(t5, t5, X2, curve->p, num_words); /* t5 = D - B - C = x3 */
    uECC_vli_modSub(X2, X2, X1, curve->p, num_words); /* t3 = C - B */
    uECC_vli_modMult_fast(Y1, Y1, X2, curve);                /* t2 = y1*(C - B) */
    uECC_vli_modSub(X2, X1, t5, curve->p, num_words); /* t3 = B - x3 */
    uECC_vli_modMult_fast(Y2, Y2, X2, curve);                /* t4 = (y2 - y1)*(B - x3) */
    uECC_vli_modSub(Y2, Y2, Y1, curve->p, num_words); /* t4 = y3 */

    uECC_vli_set(X2, t5, num_words);
}